

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAttach(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar1 = Abc_NtkIsSopLogic(pNtk_00);
      if (iVar1 == 0) {
        Abc_Print(-1,"Can only attach gates if the nodes have SOP representations.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Abc_NtkAttach(pNtk_00);
        if (iVar1 == 0) {
          Abc_Print(-1,"Attaching gates has failed.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          pAbc_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    Abc_Print(-2,"usage: attach [-h]\n");
    Abc_Print(-2,"\t        replaces the SOP functions by the gates from the library\n");
    Abc_Print(-2,"\t-h    : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandAttach( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        Abc_Print( -1, "Can only attach gates if the nodes have SOP representations.\n" );
        return 1;
    }

    // get the new network
    if ( !Abc_NtkAttach( pNtk ) )
    {
        Abc_Print( -1, "Attaching gates has failed.\n" );
        return 1;
    }
    return 0;

usage:
    Abc_Print( -2, "usage: attach [-h]\n" );
    Abc_Print( -2, "\t        replaces the SOP functions by the gates from the library\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}